

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O2

void __thiscall disp::get_2(disp *this,int x,int y)

{
  string sStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  to_string<int>(&local_58,x);
  std::operator+(&local_98,"get_2:",&local_58);
  std::operator+(&local_78,&local_98,":");
  to_string<int>(&sStack_b8,y);
  std::operator+(&local_38,&local_78,&sStack_b8);
  std::__cxx11::string::operator=((string *)&this->v_,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void get_2(int x,int y) { v_="get_2:" + to_string(x) + ":" + to_string(y); }